

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O1

void __thiscall
Rml::ElementDocument::OnPropertyChange(ElementDocument *this,PropertyIdSet *changed_properties)

{
  ElementStyle *this_00;
  
  Element::OnPropertyChange(&this->super_Element,changed_properties);
  if (((changed_properties->defined_ids).super__Base_bitset<2UL>._M_w[0] & 0x4000000000000) != 0) {
    this_00 = Element::GetStyle(&this->super_Element);
    ElementStyle::DirtyPropertiesWithUnitsRecursive(this_00,REM);
  }
  if (((changed_properties->defined_ids).super__Base_bitset<2UL>._M_w[0] & 0x7800000) != 0) {
    this->position_dirty = true;
  }
  return;
}

Assistant:

void ElementDocument::OnPropertyChange(const PropertyIdSet& changed_properties)
{
	Element::OnPropertyChange(changed_properties);

	// If the document's font-size has been changed, we need to dirty all rem properties.
	if (changed_properties.Contains(PropertyId::FontSize))
		GetStyle()->DirtyPropertiesWithUnitsRecursive(Unit::REM);

	if (changed_properties.Contains(PropertyId::Top) ||    //
		changed_properties.Contains(PropertyId::Right) ||  //
		changed_properties.Contains(PropertyId::Bottom) || //
		changed_properties.Contains(PropertyId::Left))
		DirtyPosition();
}